

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void subclass_cb(Fl_Input *i,void *v)

{
  char *n;
  Fl_Widget_Type *this;
  bool bVar1;
  int iVar2;
  Fl_Widget_Type *t;
  Fl_Type **ppFVar3;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar2 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    Fl_Input_::static_value(&i->super_Fl_Input_,current_widget->subclass_);
    return;
  }
  n = (i->super_Fl_Input_).value_;
  bVar1 = false;
  ppFVar3 = &Fl_Type::first;
  while (this = (Fl_Widget_Type *)*ppFVar3, this != (Fl_Widget_Type *)0x0) {
    if ((this->super_Fl_Type).selected != '\0') {
      iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
      if (iVar2 != 0) {
        Fl_Widget_Type::subclass(this,n);
        bVar1 = true;
      }
    }
    ppFVar3 = &(this->super_Fl_Type).next;
  }
  if (bVar1) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void subclass_cb(Fl_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    i->static_value(current_widget->subclass());
  } else {
    int mod = 0;
    const char *c = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type *t = (Fl_Widget_Type*)o;
	t->subclass(c);
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}